

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O1

char * getcontent(xmlNode *attr)

{
  xmlChar *pxVar1;
  size_t sVar2;
  char *pcVar3;
  ushort **ppuVar4;
  long lVar5;
  char *__dest;
  char *pcVar6;
  char *pcVar7;
  _xmlNode *p_Var8;
  xmlChar *__s;
  
  p_Var8 = attr->children;
  if (p_Var8 == (_xmlNode *)0x0) {
    sVar2 = 1;
  }
  else {
    lVar5 = 0;
    do {
      if (p_Var8->type == XML_TEXT_NODE) {
        sVar2 = strlen((char *)p_Var8->content);
        lVar5 = lVar5 + sVar2;
      }
      p_Var8 = p_Var8->next;
    } while (p_Var8 != (_xmlNode *)0x0);
    sVar2 = lVar5 + 1;
  }
  pcVar3 = (char *)malloc(sVar2);
  __dest = pcVar3;
  for (p_Var8 = attr->children; p_Var8 != (_xmlNode *)0x0; p_Var8 = p_Var8->next) {
    if (p_Var8->type == XML_TEXT_NODE) {
      __s = p_Var8->content;
      if (__dest == pcVar3) {
        ppuVar4 = __ctype_b_loc();
        __s = __s + -1;
        do {
          pxVar1 = __s + 1;
          __s = __s + 1;
        } while ((*(byte *)((long)*ppuVar4 + (long)(char)*pxVar1 * 2 + 1) & 0x20) != 0);
      }
      sVar2 = strlen((char *)__s);
      memcpy(__dest,__s,sVar2);
      __dest = __dest + sVar2;
    }
  }
  do {
    pcVar6 = __dest;
    pcVar7 = pcVar3;
    if (pcVar6 == pcVar3) break;
    ppuVar4 = __ctype_b_loc();
    __dest = pcVar6 + -1;
    pcVar7 = pcVar6;
  } while ((*(byte *)((long)*ppuVar4 + (long)pcVar6[-1] * 2 + 1) & 0x20) != 0);
  *pcVar7 = '\0';
  return pcVar3;
}

Assistant:

static char *getcontent (xmlNode *attr) {
	xmlNode *chain = attr->children;
	size_t size = 0;
	char *content, *p;
	while (chain) {
		if (chain->type == XML_TEXT_NODE)
			size += strlen(chain->content);
		chain = chain->next;
	}
	p = content = malloc(size + 1);
	chain = attr->children;
	while (chain) {
		if (chain->type == XML_TEXT_NODE) {
			char* sp = chain->content;
			if(p == content) {
				while(isspace(*sp))
					++sp;
			}
			size_t len = strlen(sp);
			memcpy(p, sp, len);
			p += len;
		}
		chain = chain->next;
	}
	while(p != content && isspace(p[-1]))
		--p;
	*p = 0;
	return content;
}